

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

int difference_uint16(uint16_t *a1,int length1,uint16_t *a2,int length2,uint16_t *a_out)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint16_t uVar5;
  uint16_t *puVar6;
  ulong uVar7;
  ushort *puVar8;
  uint uVar9;
  
  if (length1 == 0) {
    length1 = 0;
  }
  else {
    if (length2 != 0) {
      uVar5 = *a2;
      uVar4 = 0;
      iVar3 = 0;
      puVar8 = a1;
      uVar9 = 0;
LAB_00121497:
      do {
        uVar2 = *puVar8;
        puVar6 = a2 + (iVar3 + 1);
        while (uVar5 <= uVar2) {
          if (uVar2 == uVar5) {
            uVar1 = uVar9 + 1;
            if (length1 - uVar1 == 0 || length1 < (int)uVar1) {
              return uVar4;
            }
            iVar3 = iVar3 + 1;
            if (length2 <= iVar3) {
              memmove(a_out + uVar4,a1 + (int)uVar1,(long)(int)(length1 - uVar1) * 2);
              return ~uVar9 + length1 + uVar4;
            }
            puVar8 = a1 + (int)uVar1;
            uVar5 = *puVar6;
            uVar9 = uVar1;
            goto LAB_00121497;
          }
          iVar3 = iVar3 + 1;
          if (length2 <= iVar3) {
            memmove(a_out + uVar4,a1 + (int)uVar9,(long)(int)(length1 - uVar9) * 2);
            return (uVar4 + length1) - uVar9;
          }
          uVar5 = *puVar6;
          puVar6 = puVar6 + 1;
        }
        uVar7 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        a_out[uVar7] = uVar2;
        uVar9 = uVar9 + 1;
        if (length1 <= (int)uVar9) {
          return uVar4;
        }
        puVar8 = a1 + (int)uVar9;
      } while( true );
    }
    if (a1 != a_out) {
      memcpy(a_out,a1,(long)length1 * 2);
    }
  }
  return length1;
}

Assistant:

int difference_uint16(const uint16_t *a1, int length1, const uint16_t *a2,
                      int length2, uint16_t *a_out) {
    int out_card = 0;
    int k1 = 0, k2 = 0;
    if (length1 == 0) return 0;
    if (length2 == 0) {
        if (a1 != a_out) memcpy(a_out, a1, sizeof(uint16_t) * length1);
        return length1;
    }
    uint16_t s1 = a1[k1];
    uint16_t s2 = a2[k2];
    while (true) {
        if (s1 < s2) {
            a_out[out_card++] = s1;
            ++k1;
            if (k1 >= length1) {
                break;
            }
            s1 = a1[k1];
        } else if (s1 == s2) {
            ++k1;
            ++k2;
            if (k1 >= length1) {
                break;
            }
            if (k2 >= length2) {
                memmove(a_out + out_card, a1 + k1,
                        sizeof(uint16_t) * (length1 - k1));
                return out_card + length1 - k1;
            }
            s1 = a1[k1];
            s2 = a2[k2];
        } else {  // if (val1>val2)
            ++k2;
            if (k2 >= length2) {
                memmove(a_out + out_card, a1 + k1,
                        sizeof(uint16_t) * (length1 - k1));
                return out_card + length1 - k1;
            }
            s2 = a2[k2];
        }
    }
    return out_card;
}